

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1557.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLMcode CVar2;
  undefined8 uVar3;
  CURLMcode ec_8;
  CURLMcode ec_7;
  CURLMcode ec_6;
  CURLMcode ec_5;
  CURLcode ec_4;
  CURLMcode ec_3;
  CURLcode ec_2;
  CURLMcode ec_1;
  CURLcode ec;
  int res;
  int running_handles;
  CURL *curl2;
  CURL *curl1;
  CURLM *curlm;
  char *URL_local;
  
  curl1 = (CURL *)0x0;
  curl2 = (CURL *)0x0;
  _res = 0;
  ec = CURLE_OK;
  ec_1 = CURLM_OK;
  curlm = (CURLM *)URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLM_OK) {
    uVar3 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                  ,0x24,CVar2,uVar3);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLM_OK) {
    curl1 = (CURL *)curl_multi_init();
    if (curl1 == (CURL *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                    ,0x26);
      ec_1 = 0x7b;
    }
    if (ec_1 == CURLM_OK) {
      CVar2 = curl_multi_setopt(curl1,7,1);
      uVar1 = _stderr;
      if (CVar2 != CURLM_OK) {
        uVar3 = curl_multi_strerror(CVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                      ,0x27,CVar2,uVar3);
        ec_1 = CVar2;
      }
      if (ec_1 == CURLM_OK) {
        curl2 = (CURL *)curl_easy_init();
        if (curl2 == (CURL *)0x0) {
          curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                        ,0x29);
          ec_1 = 0x7c;
        }
        if (ec_1 == CURLM_OK) {
          CVar2 = curl_easy_setopt(curl2,0x2712,curlm);
          uVar1 = _stderr;
          if (CVar2 != CURLM_OK) {
            uVar3 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                          ,0x2a,CVar2,uVar3);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLM_OK) {
            CVar2 = curl_multi_add_handle(curl1,curl2);
            uVar1 = _stderr;
            if (CVar2 != CURLM_OK) {
              uVar3 = curl_multi_strerror(CVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                            ,0x2b,CVar2,uVar3);
              ec_1 = CVar2;
            }
            if (ec_1 == CURLM_OK) {
              _res = curl_easy_init();
              if (_res == 0) {
                curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                              ,0x2d);
                ec_1 = 0x7c;
              }
              if (ec_1 == CURLM_OK) {
                CVar2 = curl_easy_setopt(_res,0x2712,curlm);
                uVar1 = _stderr;
                if (CVar2 != CURLM_OK) {
                  uVar3 = curl_easy_strerror(CVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                ,0x2e,CVar2,uVar3);
                  ec_1 = CVar2;
                }
                if (ec_1 == CURLM_OK) {
                  CVar2 = curl_multi_add_handle(curl1,_res);
                  uVar1 = _stderr;
                  if (CVar2 != CURLM_OK) {
                    uVar3 = curl_multi_strerror(CVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                  ,0x2f,CVar2,uVar3);
                    ec_1 = CVar2;
                  }
                  if (ec_1 == CURLM_OK) {
                    CVar2 = curl_multi_perform(curl1,&ec);
                    uVar1 = _stderr;
                    if (CVar2 == CURLM_OK) {
                      if ((int)ec < 0) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                      ,0x31,ec);
                        ec_1 = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(CVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                    ,0x31,CVar2,uVar3);
                      ec_1 = CVar2;
                    }
                    if (ec_1 == CURLM_OK) {
                      CVar2 = curl_multi_remove_handle(curl1,_res);
                      uVar1 = _stderr;
                      if (CVar2 != CURLM_OK) {
                        uVar3 = curl_multi_strerror(CVar2);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                      ,0x33,CVar2,uVar3);
                        ec_1 = CVar2;
                      }
                      if ((ec_1 == CURLM_OK) &&
                         (CVar2 = curl_multi_remove_handle(curl1,curl2), uVar1 = _stderr,
                         CVar2 != CURLM_OK)) {
                        uVar3 = curl_multi_strerror(CVar2);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                      ,0x36,CVar2,uVar3);
                        ec_1 = CVar2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(curl2);
    curl_easy_cleanup(_res);
    curl_multi_cleanup(curl1);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLM *curlm = NULL;
  CURL *curl1 = NULL;
  CURL *curl2 = NULL;
  int running_handles = 0;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  multi_init(curlm);
  multi_setopt(curlm, CURLMOPT_MAX_HOST_CONNECTIONS, 1);

  easy_init(curl1);
  easy_setopt(curl1, CURLOPT_URL, URL);
  multi_add_handle(curlm, curl1);

  easy_init(curl2);
  easy_setopt(curl2, CURLOPT_URL, URL);
  multi_add_handle(curlm, curl2);

  multi_perform(curlm, &running_handles);

  multi_remove_handle(curlm, curl2);

  /* If curl2 is still in the connect-pending list, this will crash */
  multi_remove_handle(curlm, curl1);

test_cleanup:
  curl_easy_cleanup(curl1);
  curl_easy_cleanup(curl2);
  curl_multi_cleanup(curlm);
  curl_global_cleanup();
  return res;
}